

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChargeDensityZ.cpp
# Opt level: O1

void __thiscall OpenMD::ChargeDensityZ::process(ChargeDensityZ *this)

{
  Mat3x3d *pMVar1;
  undefined8 *puVar2;
  _Rb_tree_node_base *p_Var3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  SimInfo *info;
  Snapshot *pSVar7;
  iterator iVar8;
  pointer pdVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  bool bVar12;
  int iVar13;
  long lVar14;
  double *pdVar15;
  _Base_ptr p_Var16;
  StuntDouble *pSVar17;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar18;
  mapped_type *pmVar19;
  mapped_type *pmVar20;
  mapped_type_conflict *pmVar21;
  vector<double,std::allocator<double>> *pvVar22;
  mapped_type *pmVar23;
  uint i;
  uint i_1;
  long lVar24;
  size_t index;
  ulong uVar25;
  double *pdVar26;
  pointer ppAVar27;
  ulong uVar28;
  RealType RVar29;
  SelectionManager *pSVar30;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  double dVar35;
  double dVar36;
  pair<std::_Rb_tree_iterator<int>,_std::_Rb_tree_iterator<int>_> pVar37;
  int globalIndex;
  string atomName;
  RealType q;
  Vector3d pos;
  int kk;
  vector<int,_std::allocator<int>_> cartesian_axis;
  vector<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_> atChain;
  set<int,_std::less<int>,_std::allocator<int>_> axisValues;
  DumpReader reader;
  int local_1444;
  undefined1 local_1440 [32];
  mapped_type_conflict local_1420;
  _Alloc_hider local_1418;
  int local_140c;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1408;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_13f8;
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *local_13e8;
  double *local_13e0;
  _Base_ptr local_13d8;
  SelectionManager *local_13d0;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
  *local_13c8;
  map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_> *local_13c0;
  StuntDouble *local_13b8;
  undefined8 uStack_13b0;
  map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_> *local_13a8;
  map<int,_std::vector<double,_std::allocator<double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<double,_std::allocator<double>_>_>_>_>
  *local_13a0;
  _Base_ptr local_1398;
  _Rb_tree_node_base *local_1390;
  map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_1388;
  int *local_1380;
  double local_1378;
  double local_1370;
  double local_1368;
  int local_1360;
  int local_135c;
  uint *local_1358;
  iterator iStack_1350;
  int *local_1348;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  *local_1338;
  undefined8 uStack_1330;
  mapped_type_conflict local_1328;
  undefined8 uStack_1320;
  vector<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_> local_1310;
  map<int,_std::vector<double,_std::allocator<double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<double,_std::allocator<double>_>_>_>_>
  *local_12f8;
  undefined8 uStack_12f0;
  long local_12e8;
  double *local_12e0;
  SelectionEvaluator *local_12d8;
  undefined1 local_12d0 [16];
  _Base_ptr local_12c0 [3];
  double local_12a8;
  DumpReader local_1288;
  
  info = (this->super_StaticAnalyser).info_;
  local_1378 = (double)CONCAT71(local_1378._1_7_,
                                (info->simParams_->UsePeriodicBoundaryConditions).
                                super_ParameterBase.field_0x2b);
  DumpReader::DumpReader(&local_1288,info,&(this->super_StaticAnalyser).dumpFilename_);
  local_140c = DumpReader::getNFrames(&local_1288);
  this->nProcessed_ = local_140c / (this->super_StaticAnalyser).step_;
  DumpReader::readFrame(&local_1288,1);
  pSVar7 = ((this->super_StaticAnalyser).info_)->sman_->currentSnapshot_;
  this->currentSnapshot_ = pSVar7;
  Snapshot::getHmat((Mat3x3d *)local_12d0,pSVar7);
  pMVar1 = &this->hmat_;
  if (pMVar1 != (Mat3x3d *)local_12d0) {
    lVar14 = 0;
    do {
      *(undefined8 *)
       ((long)(this->hmat_).super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0]
       + lVar14 + 0x10) = *(undefined8 *)((long)local_12c0 + lVar14);
      uVar10 = *(undefined8 *)(local_12d0 + lVar14 + 8);
      puVar2 = (undefined8 *)
               ((long)(pMVar1->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_
                      [0] + lVar14);
      *puVar2 = *(undefined8 *)(local_12d0 + lVar14);
      puVar2[1] = uVar10;
      lVar14 = lVar14 + 0x18;
    } while (lVar14 != 0x48);
  }
  pdVar26 = (double *)
            ((long)(pMVar1->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_ +
            (ulong)(uint)this->axis_ * 0x20);
  iVar8._M_current =
       (this->zBox_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar8._M_current ==
      (this->zBox_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
              ((vector<double,std::allocator<double>> *)&this->zBox_,iVar8,pdVar26);
  }
  else {
    *iVar8._M_current = *pdVar26;
    (this->zBox_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar8._M_current + 1;
  }
  pdVar26 = (this->zBox_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish;
  local_1368 = 0.0;
  local_12e0 = (this->zBox_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
  for (pdVar15 = local_12e0; pdVar15 != pdVar26; pdVar15 = pdVar15 + 1) {
    local_1368 = local_1368 + *pdVar15;
  }
  p_Var3 = (_Rb_tree_node_base *)(local_12d0 + 8);
  local_12d0._8_4_ = _S_red;
  local_12c0[0] = (_Base_ptr)0x0;
  local_12a8 = 0.0;
  local_1440._0_4_ = 0;
  local_12c0[1] = p_Var3;
  local_12c0[2] = p_Var3;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
  _M_insert_unique<int>
            ((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
             local_12d0,(int *)local_1440);
  local_1440._0_4_ = 1;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
  _M_insert_unique<int>
            ((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
             local_12d0,(int *)local_1440);
  local_1440._0_4_ = 2;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
  _M_insert_unique<int>
            ((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
             local_12d0,(int *)local_1440);
  local_1380 = &this->axis_;
  local_13e0 = pdVar26;
  pVar37 = std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
           equal_range((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>
                        *)local_12d0,local_1380);
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::_M_erase_aux
            ((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
             local_12d0,(_Base_ptr)pVar37.first._M_node,(_Base_ptr)pVar37.second._M_node);
  local_1358 = (uint *)0x0;
  iStack_1350._M_current = (int *)0x0;
  local_1348 = (int *)0x0;
  if (local_12c0[1] != p_Var3) {
    p_Var16 = local_12c0[1];
    do {
      if (iStack_1350._M_current == local_1348) {
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                  ((vector<int,std::allocator<int>> *)&local_1358,iStack_1350,(int *)(p_Var16 + 1));
      }
      else {
        *iStack_1350._M_current = p_Var16[1]._M_color;
        iStack_1350._M_current = iStack_1350._M_current + 1;
      }
      p_Var16 = (_Base_ptr)std::_Rb_tree_increment(p_Var16);
    } while (p_Var16 != p_Var3);
  }
  uVar4 = *local_1358;
  this->x_ = uVar4;
  uVar5 = local_1358[1];
  this->y_ = uVar5;
  local_1370 = *(double *)
                ((long)(pMVar1->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.
                       data_ + (ulong)uVar4 * 0x20) *
               *(double *)
                ((long)(pMVar1->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.
                       data_ + (ulong)uVar5 * 0x20);
  local_12e8 = (long)(this->densityZAverageAllFrame_).
                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)(this->densityZAverageAllFrame_).
                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start;
  pdVar26 = local_13e0;
  if (1 < local_140c) {
    local_12d8 = &this->evaluator_;
    local_13d0 = &this->seleMan_;
    local_1388 = &this->atomNameGlobalIndex_;
    local_13e8 = &this->countUsingGlobalIndex_;
    local_13c0 = &this->averageChargeUsingGlobalIndex_;
    local_12f8 = &this->totalChargeUsingGlobalIndex_;
    local_1390 = (_Rb_tree_node_base *)&this->zPosUsingGlobalIndex_;
    local_1398 = (_Base_ptr)&this->xPosUsingGlobalIndex_;
    local_13a0 = &this->yPosUsingGlobalIndex_;
    local_13a8 = &this->vanderRUsingGlobalIndex_;
    local_13d8 = &(this->atomNameGlobalIndex_)._M_t._M_impl.super__Rb_tree_header._M_header;
    local_1338 = &this->SDCount_;
    local_13c8 = &this->averageChargeForEachType_;
    iVar13 = 1;
    do {
      local_1360 = iVar13;
      DumpReader::readFrame(&local_1288,iVar13);
      this->currentSnapshot_ = ((this->super_StaticAnalyser).info_)->sman_->currentSnapshot_;
      if ((this->evaluator_).isDynamic_ == true) {
        SelectionEvaluator::evaluate((SelectionSet *)local_1440,local_12d8);
        lVar14 = 0;
        do {
          std::vector<bool,_std::allocator<bool>_>::operator=
                    ((vector<bool,_std::allocator<bool>_> *)
                     ((long)&(((this->seleMan_).ss_.bitsets_.
                               super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                               ._M_impl.super__Vector_impl_data._M_start)->bitset_).
                             super__Bvector_base<std::allocator<bool>_>._M_impl.
                             super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p +
                     lVar14),(vector<bool,_std::allocator<bool>_> *)(local_1440._0_8_ + lVar14));
          lVar14 = lVar14 + 0x28;
        } while (lVar14 != 0xf0);
        std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::~vector
                  ((vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_> *)local_1440
                  );
        pdVar26 = local_13e0;
      }
      pSVar17 = SelectionManager::beginSelected(local_13d0,&local_135c);
      while (pSVar17 != (StuntDouble *)0x0) {
        if (otDAtom < pSVar17->objType_) {
          memcpy(&painCave,"Can not calculate charge density distribution if it is not atom\n",0x41)
          ;
          painCave.isFatal = 1;
          painCave.severity = 1;
          simError();
        }
        local_1418._M_p = (pointer)0x0;
        paVar18 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)pSVar17[1]._vptr_StuntDouble;
        if (pSVar17->objType_ < otRigidBody) {
          local_1440._0_8_ = paVar18;
          bVar12 = FixedChargeAdapter::isFixedCharge((FixedChargeAdapter *)local_1440);
          if (bVar12) {
            RVar29 = FixedChargeAdapter::getCharge((FixedChargeAdapter *)local_1440);
            local_1418._M_p = (pointer)(RVar29 + local_1418._M_p);
          }
          local_1408._M_allocated_capacity = (size_type)paVar18;
          bVar12 = FluctuatingChargeAdapter::isFluctuatingCharge
                             ((FluctuatingChargeAdapter *)&local_1408._M_allocated_capacity);
          if (bVar12) {
            local_1418._M_p =
                 (pointer)(*(double *)
                            (*(long *)((long)&(pSVar17->snapshotMan_->currentSnapshot_->atomData).
                                              flucQPos.
                                              super__Vector_base<double,_std::allocator<double>_>.
                                              _M_impl.super__Vector_impl_data._M_start +
                                      pSVar17->storage_) + (long)pSVar17->localIndex_ * 8) +
                          local_1418._M_p);
          }
        }
        local_1440._0_8_ = local_1440 + 0x10;
        local_1440._8_8_ = (pointer)0x0;
        local_1440[0x10] = '\0';
        AtomType::allYourBase(&local_1310,(AtomType *)paVar18);
        local_13b8 = pSVar17;
        local_1420 = 0.0;
        ppAVar27 = local_1310.
                   super__Vector_base<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>.
                   _M_impl.super__Vector_impl_data._M_start;
        while( true ) {
          bVar12 = ppAVar27 ==
                   local_1310.
                   super__Vector_base<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
          if (bVar12) break;
          AtomType::getName_abi_cxx11_((string *)&local_1408,*ppAVar27);
          uVar11 = local_1408._M_allocated_capacity;
          uVar10 = local_1440._8_8_;
          strlen((char *)local_1408._M_allocated_capacity);
          std::__cxx11::string::_M_replace((ulong)local_1440,0,(char *)uVar10,uVar11);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1408._M_allocated_capacity != &local_13f8) {
            operator_delete((void *)local_1408._M_allocated_capacity,
                            local_13f8._M_allocated_capacity + 1);
          }
          AtomType::getName_abi_cxx11_((string *)&local_1408,*ppAVar27);
          iVar13 = ElementsTable::GetAtomicNum
                             ((ElementsTable *)etab,(char *)local_1408._M_allocated_capacity);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1408._M_allocated_capacity != &local_13f8) {
            operator_delete((void *)local_1408._M_allocated_capacity,
                            local_13f8._M_allocated_capacity + 1);
          }
          if (iVar13 != 0) {
            local_1420 = ElementsTable::GetVdwRad((ElementsTable *)etab,iVar13);
            break;
          }
          ppAVar27 = ppAVar27 + 1;
        }
        pSVar17 = local_13b8;
        if (bVar12) {
          local_1420 = this->vRadius_;
        }
        paVar18 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)((long)local_13b8->localIndex_ * 0x18 +
                     *(long *)((long)&(local_13b8->snapshotMan_->currentSnapshot_->atomData).
                                      position.
                                      super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start +
                              local_13b8->storage_));
        local_1408._M_allocated_capacity = 0;
        local_1408._8_8_ = 0;
        local_13f8._M_allocated_capacity = 0;
        if (paVar18 != &local_1408) {
          lVar14 = 0;
          do {
            (&local_1408._M_allocated_capacity)[lVar14] = (&paVar18->_M_allocated_capacity)[lVar14];
            lVar14 = lVar14 + 1;
          } while (lVar14 != 3);
        }
        if (local_1378._0_1_ != '\0') {
          Snapshot::wrapVector(this->currentSnapshot_,(Vector3d *)&local_1408);
        }
        pSVar7 = pSVar17->snapshotMan_->currentSnapshot_;
        lVar14 = (long)pSVar17->localIndex_;
        paVar18 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(lVar14 * 0x18 +
                     *(long *)((long)&(pSVar7->atomData).position.
                                      super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start + pSVar17->storage_)
                     );
        if (paVar18 != &local_1408) {
          lVar24 = 0;
          do {
            (&paVar18->_M_allocated_capacity)[lVar24] = (&local_1408._M_allocated_capacity)[lVar24];
            lVar24 = lVar24 + 1;
          } while (lVar24 != 3);
        }
        lVar24 = *(long *)((long)&(pSVar7->atomData).position.
                                  super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start + pSVar17->storage_);
        puVar2 = (undefined8 *)(lVar24 + lVar14 * 0x18);
        local_1408._M_allocated_capacity = *puVar2;
        local_1408._8_8_ = puVar2[1];
        local_13f8._M_allocated_capacity = *(size_type *)(lVar24 + 0x10 + lVar14 * 0x18);
        local_1444 = pSVar17->globalIndex_;
        pmVar19 = std::
                  map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator[](local_1388,&local_1444);
        std::__cxx11::string::_M_assign((string *)pmVar19);
        pmVar20 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                  operator[](local_13e8,&local_1444);
        iVar13 = *pmVar20;
        pmVar21 = std::
                  map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>::
                  operator[](local_13c0,&local_1444);
        local_1328 = *pmVar21;
        local_13b8 = (StuntDouble *)local_1418._M_p;
        pmVar20 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                  operator[](local_13e8,&local_1444);
        iVar6 = *pmVar20;
        pmVar21 = std::
                  map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>::
                  operator[](local_13c0,&local_1444);
        *pmVar21 = ((double)iVar13 * local_1328 + (double)local_13b8) / (double)(iVar6 + 1);
        pvVar22 = (vector<double,std::allocator<double>> *)
                  std::
                  map<int,_std::vector<double,_std::allocator<double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<double,_std::allocator<double>_>_>_>_>
                  ::operator[](local_12f8,&local_1444);
        iVar8._M_current = *(double **)(pvVar22 + 8);
        if (iVar8._M_current == *(double **)(pvVar22 + 0x10)) {
          std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                    (pvVar22,iVar8,(double *)&local_1418);
        }
        else {
          *iVar8._M_current = (double)local_1418._M_p;
          *(double **)(pvVar22 + 8) = iVar8._M_current + 1;
        }
        pvVar22 = (vector<double,std::allocator<double>> *)
                  std::
                  map<int,_std::vector<double,_std::allocator<double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<double,_std::allocator<double>_>_>_>_>
                  ::operator[]((map<int,_std::vector<double,_std::allocator<double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<double,_std::allocator<double>_>_>_>_>
                                *)local_1390,&local_1444);
        iVar8._M_current = *(double **)(pvVar22 + 8);
        if (iVar8._M_current == *(double **)(pvVar22 + 0x10)) {
          std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                    (pvVar22,iVar8,(double *)(&local_1408._M_allocated_capacity + (uint)*local_1380)
                    );
        }
        else {
          *iVar8._M_current = (double)(&local_1408._M_allocated_capacity)[(uint)*local_1380];
          *(double **)(pvVar22 + 8) = iVar8._M_current + 1;
        }
        pvVar22 = (vector<double,std::allocator<double>> *)
                  std::
                  map<int,_std::vector<double,_std::allocator<double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<double,_std::allocator<double>_>_>_>_>
                  ::operator[]((map<int,_std::vector<double,_std::allocator<double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<double,_std::allocator<double>_>_>_>_>
                                *)local_1398,&local_1444);
        iVar8._M_current = *(double **)(pvVar22 + 8);
        if (iVar8._M_current == *(double **)(pvVar22 + 0x10)) {
          std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                    (pvVar22,iVar8,(double *)(&local_1408._M_allocated_capacity + (uint)this->x_));
        }
        else {
          *iVar8._M_current = (double)(&local_1408._M_allocated_capacity)[(uint)this->x_];
          *(double **)(pvVar22 + 8) = iVar8._M_current + 1;
        }
        pvVar22 = (vector<double,std::allocator<double>> *)
                  std::
                  map<int,_std::vector<double,_std::allocator<double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<double,_std::allocator<double>_>_>_>_>
                  ::operator[](local_13a0,&local_1444);
        iVar8._M_current = *(double **)(pvVar22 + 8);
        if (iVar8._M_current == *(double **)(pvVar22 + 0x10)) {
          std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                    (pvVar22,iVar8,(double *)(&local_1408._M_allocated_capacity + (uint)this->y_));
        }
        else {
          *iVar8._M_current = (double)(&local_1408._M_allocated_capacity)[(uint)this->y_];
          *(double **)(pvVar22 + 8) = iVar8._M_current + 1;
        }
        pmVar21 = std::
                  map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>::
                  operator[](local_13a8,&local_1444);
        *pmVar21 = local_1420;
        pmVar20 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                  operator[](local_13e8,&local_1444);
        *pmVar20 = *pmVar20 + 1;
        if (local_1310.super__Vector_base<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_1310.
                          super__Vector_base<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_1310.
                                super__Vector_base<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_1310.
                                super__Vector_base<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        pdVar26 = local_13e0;
        if ((pointer)local_1440._0_8_ != (pointer)(local_1440 + 0x10)) {
          operator_delete((void *)local_1440._0_8_,CONCAT71(local_1440._17_7_,local_1440[0x10]) + 1)
          ;
        }
        pSVar17 = SelectionManager::nextSelected(local_13d0,&local_135c);
      }
      p_Var16 = (this->atomNameGlobalIndex_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      if (p_Var16 != local_13d8) {
        do {
          local_1408._M_allocated_capacity._0_4_ = p_Var16[1]._M_color;
          local_1440._0_8_ = local_1440 + 0x10;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_1440,p_Var16[1]._M_parent,
                     (long)&(p_Var16[1]._M_left)->_M_color + (long)p_Var16[1]._M_parent);
          pmVar20 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                    ::operator[](local_1338,(key_type *)local_1440);
          local_1420 = (mapped_type_conflict)*pmVar20;
          pmVar21 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                    ::operator[](local_13c8,(key_type *)local_1440);
          local_13b8 = (StuntDouble *)*pmVar21;
          pmVar23 = std::
                    map<int,_std::vector<double,_std::allocator<double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<double,_std::allocator<double>_>_>_>_>
                    ::operator[](local_12f8,(key_type *)local_1408._M_local_buf);
          local_1328 = *(pmVar23->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                        super__Vector_impl_data._M_start;
          pmVar20 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                    ::operator[](local_1338,(key_type *)local_1440);
          iVar13 = *pmVar20;
          pmVar21 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                    ::operator[](local_13c8,(key_type *)local_1440);
          *pmVar21 = (local_1420 * (double)local_13b8 + local_1328) / (double)(iVar13 + 1);
          pmVar20 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                    ::operator[](local_1338,(key_type *)local_1440);
          *pmVar20 = *pmVar20 + 1;
          if ((pointer)local_1440._0_8_ != (pointer)(local_1440 + 0x10)) {
            operator_delete((void *)local_1440._0_8_,
                            CONCAT71(local_1440._17_7_,local_1440[0x10]) + 1);
          }
          p_Var16 = (_Base_ptr)std::_Rb_tree_increment(p_Var16);
        } while (p_Var16 != local_13d8);
      }
      iVar13 = local_1360 + (this->super_StaticAnalyser).step_;
    } while (iVar13 < local_140c);
  }
  p_Var16 = (this->atomNameGlobalIndex_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_1398 = &(this->atomNameGlobalIndex_)._M_t._M_impl.super__Rb_tree_header._M_header;
  if (p_Var16 != local_1398) {
    lVar14 = (long)pdVar26 - (long)local_12e0 >> 3;
    auVar31._8_4_ = (int)((long)pdVar26 - (long)local_12e0 >> 0x23);
    auVar31._0_8_ = lVar14;
    auVar31._12_4_ = 0x45300000;
    local_1368 = local_1368 /
                 ((auVar31._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)lVar14) - 4503599627370496.0));
    auVar32._8_4_ = (int)(local_12e8 >> 0x23);
    auVar32._0_8_ = local_12e8 >> 3;
    auVar32._12_4_ = 0x45300000;
    local_1370 = local_1370 *
                 (local_1368 /
                 ((auVar32._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)(local_12e8 >> 3)) - 4503599627370496.0)));
    local_13a0 = (map<int,_std::vector<double,_std::allocator<double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<double,_std::allocator<double>_>_>_>_>
                  *)&this->averageChargeUsingGlobalIndex_;
    local_13a8 = (map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_> *
                 )&this->averageChargeForEachType_;
    local_13d8 = (_Base_ptr)&this->vanderRUsingGlobalIndex_;
    local_13e0 = (double *)(local_1368 * 0.5);
    do {
      local_1408._M_allocated_capacity._0_4_ = p_Var16[1]._M_color;
      local_1440._0_8_ = local_1440 + 0x10;
      local_1390 = p_Var16;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_1440,p_Var16[1]._M_parent,
                 (long)&(p_Var16[1]._M_left)->_M_color + (long)p_Var16[1]._M_parent);
      pmVar21 = std::
                map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>::
                operator[]((map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
                            *)local_13a0,(key_type *)local_1408._M_local_buf);
      local_1380 = (int *)*pmVar21;
      pmVar21 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                              *)local_13a8,(key_type *)local_1440);
      local_1388 = (map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)*pmVar21;
      pmVar21 = std::
                map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>::
                operator[]((map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
                            *)local_13d8,(key_type *)local_1408._M_local_buf);
      dVar35 = *pmVar21;
      local_13e8 = (map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
                   (dVar35 * 6.283185307179586 * dVar35);
      local_13c8 = (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                    *)(dVar35 * dVar35 + dVar35 * dVar35);
      local_13d0 = (SelectionManager *)SQRT((double)local_13e8);
      for (uVar25 = 0;
          pmVar23 = std::
                    map<int,_std::vector<double,_std::allocator<double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<double,_std::allocator<double>_>_>_>_>
                    ::operator[](&this->zPosUsingGlobalIndex_,(key_type *)local_1408._M_local_buf),
          uVar25 < (ulong)((long)(pmVar23->super__Vector_base<double,_std::allocator<double>_>).
                                 _M_impl.super__Vector_impl_data._M_finish -
                           (long)(pmVar23->super__Vector_base<double,_std::allocator<double>_>).
                                 _M_impl.super__Vector_impl_data._M_start >> 3); uVar25 = uVar25 + 1
          ) {
        pmVar23 = std::
                  map<int,_std::vector<double,_std::allocator<double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<double,_std::allocator<double>_>_>_>_>
                  ::operator[](&this->zPosUsingGlobalIndex_,(key_type *)local_1408._M_local_buf);
        local_1420 = (pmVar23->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                     super__Vector_impl_data._M_start[uVar25];
        pmVar23 = std::
                  map<int,_std::vector<double,_std::allocator<double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<double,_std::allocator<double>_>_>_>_>
                  ::operator[](&this->totalChargeUsingGlobalIndex_,
                               (key_type *)local_1408._M_local_buf);
        if ((this->densityFlucZAverageAllFrame_).super__Vector_base<double,_std::allocator<double>_>
            ._M_impl.super__Vector_impl_data._M_finish !=
            (this->densityFlucZAverageAllFrame_).super__Vector_base<double,_std::allocator<double>_>
            ._M_impl.super__Vector_impl_data._M_start) {
          local_13c0 = (map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
                        *)(pmVar23->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                          super__Vector_impl_data._M_start[uVar25];
          dVar35 = ABS((double)local_13c0 - (double)local_1380);
          local_13b8 = (StuntDouble *)
                       (-(ulong)(1e-10 < dVar35) & (ulong)((double)local_13c0 - (double)local_1380))
          ;
          uStack_13b0 = 0;
          dVar36 = ABS((double)local_13c0 - (double)local_1388);
          local_1328 = (mapped_type_conflict)
                       (-(ulong)(1e-10 < dVar36) & (ulong)((double)local_13c0 - (double)local_1388))
          ;
          uStack_1320 = 0;
          dVar35 = (double)(-(ulong)(1e-10 < dVar35) & (ulong)dVar35);
          local_1338 = (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                        *)(dVar35 * dVar35);
          uStack_1330 = 0;
          dVar36 = (double)(-(ulong)(1e-10 < dVar36) & (ulong)dVar36);
          local_12f8 = (map<int,_std::vector<double,_std::allocator<double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<double,_std::allocator<double>_>_>_>_>
                        *)(dVar36 * dVar36);
          uStack_12f0 = 0;
          uVar28 = 0;
          do {
            auVar33._8_4_ = (int)(uVar28 >> 0x20);
            auVar33._0_8_ = uVar28;
            auVar33._12_4_ = 0x45300000;
            lVar14 = (long)(this->densityZAverageAllFrame_).
                           super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_finish -
                     (long)(this->densityZAverageAllFrame_).
                           super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_start;
            lVar24 = lVar14 >> 3;
            auVar34._8_4_ = (int)(lVar14 >> 0x23);
            auVar34._0_8_ = lVar24;
            auVar34._12_4_ = 0x45300000;
            dVar35 = local_1420 -
                     ((((auVar33._8_8_ - 1.9342813113834067e+25) +
                       ((double)CONCAT44(0x43300000,(int)uVar28) - 4503599627370496.0)) * local_1368
                      ) / ((auVar34._8_8_ - 1.9342813113834067e+25) +
                          ((double)CONCAT44(0x43300000,(int)lVar24) - 4503599627370496.0)) -
                     (double)local_13e0);
            dVar35 = exp((-dVar35 * dVar35) / (double)local_13c8);
            pSVar30 = local_13d0;
            if ((double)local_13e8 < 0.0) {
              local_1378 = dVar35;
              pSVar30 = (SelectionManager *)sqrt((double)local_13e8);
              dVar35 = local_1378;
            }
            dVar35 = dVar35 / ((double)pSVar30 * local_1370);
            pdVar9 = (this->densityZAverageAllFrame_).
                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start;
            pdVar9[uVar28] = (double)local_13c0 * dVar35 + pdVar9[uVar28];
            pdVar9 = (this->densityFlucZAverageAllFrame_).
                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start;
            pdVar9[uVar28] = (double)local_13b8 * dVar35 + pdVar9[uVar28];
            pdVar9 = (this->absDensityFlucZAverageAllFrame_).
                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start;
            pdVar9[uVar28] = (double)local_1338 * dVar35 + pdVar9[uVar28];
            pdVar9 = (this->densityFlucZAverageFirstFrame_).
                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start;
            pdVar9[uVar28] = local_1328 * dVar35 + pdVar9[uVar28];
            pdVar9 = (this->absDensityFlucZAverageFirstFrame_).
                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start;
            pdVar9[uVar28] = dVar35 * (double)local_12f8 + pdVar9[uVar28];
            uVar28 = uVar28 + 1;
          } while (uVar28 < (ulong)((long)(this->densityFlucZAverageAllFrame_).
                                          super__Vector_base<double,_std::allocator<double>_>.
                                          _M_impl.super__Vector_impl_data._M_finish -
                                    (long)(this->densityFlucZAverageAllFrame_).
                                          super__Vector_base<double,_std::allocator<double>_>.
                                          _M_impl.super__Vector_impl_data._M_start >> 3));
        }
      }
      if ((pointer)local_1440._0_8_ != (pointer)(local_1440 + 0x10)) {
        operator_delete((void *)local_1440._0_8_,CONCAT71(local_1440._17_7_,local_1440[0x10]) + 1);
      }
      p_Var16 = (_Base_ptr)std::_Rb_tree_increment(local_1390);
    } while (p_Var16 != local_1398);
  }
  (*(this->super_StaticAnalyser)._vptr_StaticAnalyser[4])(this);
  if (this->genXYZ_ == true) {
    (*(this->super_StaticAnalyser)._vptr_StaticAnalyser[5])(this);
  }
  if (local_1358 != (uint *)0x0) {
    operator_delete(local_1358,(long)local_1348 - (long)local_1358);
  }
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            ((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
             local_12d0);
  DumpReader::~DumpReader(&local_1288);
  return;
}

Assistant:

void ChargeDensityZ::process() {
    bool usePeriodicBoundaryConditions_ =
        info_->getSimParams()->getUsePeriodicBoundaryConditions();

    DumpReader reader(info_, dumpFilename_);
    int nFrames_ = reader.getNFrames();
    nProcessed_  = nFrames_ / step_;

    // test using global index starts hereby

    reader.readFrame(1);
    currentSnapshot_ = info_->getSnapshotManager()->getCurrentSnapshot();

    hmat_ = currentSnapshot_->getHmat();
    zBox_.push_back(hmat_(axis_, axis_));

    std::vector<RealType>::iterator j;
    RealType zSum = 0.0;
    for (j = zBox_.begin(); j != zBox_.end(); ++j) {
      zSum += *j;
    }

    RealType zAve = zSum / zBox_.size();
    set<int> axisValues;
    axisValues.insert(0);
    axisValues.insert(1);
    axisValues.insert(2);
    axisValues.erase(axis_);
    set<int>::iterator axis_it;
    std::vector<int> cartesian_axis;
    for (axis_it = axisValues.begin(); axis_it != axisValues.end(); ++axis_it) {
      cartesian_axis.push_back(*axis_it);
    }
    x_                   = cartesian_axis[0];
    y_                   = cartesian_axis[1];
    RealType area        = hmat_(x_, x_) * hmat_(y_, y_);
    RealType sliceVolume = zAve / densityZAverageAllFrame_.size() * area;

    for (int i = 1; i < nFrames_; i += step_) {
      reader.readFrame(i);
      currentSnapshot_ = info_->getSnapshotManager()->getCurrentSnapshot();

      if (evaluator_.isDynamic()) {
        seleMan_.setSelectionSet(evaluator_.evaluate());
      }

      int kk;
      for (StuntDouble* sd = seleMan_.beginSelected(kk); sd != NULL;
           sd              = seleMan_.nextSelected(kk)) {
        if (!sd->isAtom()) {
          snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                   "Can not calculate charge density distribution if it is not "
                   "atom\n");
          painCave.severity = OPENMD_ERROR;
          painCave.isFatal  = 1;
          simError();
        }

        RealType q = 0.0;
        Atom* atom = static_cast<Atom*>(sd);

        AtomType* atomType = atom->getAtomType();

        if (sd->isAtom()) {
          FixedChargeAdapter fca = FixedChargeAdapter(atomType);
          if (fca.isFixedCharge()) { q += fca.getCharge(); }

          FluctuatingChargeAdapter fqa = FluctuatingChargeAdapter(atomType);
          if (fqa.isFluctuatingCharge()) { q += atom->getFlucQPos(); }
        }
        int obanum(0);
        RealType sigma(0);
        std::string atomName;
        std::vector<AtomType*> atChain = atomType->allYourBase();
        std::vector<AtomType*>::iterator i;
        for (i = atChain.begin(); i != atChain.end(); ++i) {
          atomName = (*i)->getName().c_str();
          obanum   = etab.GetAtomicNum((*i)->getName().c_str());
          if (obanum != 0) {
            sigma = etab.GetVdwRad(obanum);
            break;
          }
        }
        if (obanum == 0) { sigma = vRadius_; }

        Vector3d pos = sd->getPos();
        if (usePeriodicBoundaryConditions_) currentSnapshot_->wrapVector(pos);
        sd->setPos(pos);

        pos = sd->getPos();

        int globalIndex = sd->getGlobalIndex();

        atomNameGlobalIndex_[globalIndex] = atomName;
        averageChargeUsingGlobalIndex_[globalIndex] =
            (countUsingGlobalIndex_[globalIndex] *
                 averageChargeUsingGlobalIndex_[globalIndex] +
             q) /
            (countUsingGlobalIndex_[globalIndex] + 1);
        totalChargeUsingGlobalIndex_[globalIndex].push_back(q);
        zPosUsingGlobalIndex_[globalIndex].push_back(pos[axis_]);
        xPosUsingGlobalIndex_[globalIndex].push_back(pos[x_]);
        yPosUsingGlobalIndex_[globalIndex].push_back(pos[y_]);

        vanderRUsingGlobalIndex_[globalIndex] = sigma;
        countUsingGlobalIndex_[globalIndex]++;
      }

      for (std::map<int, std::string>::iterator it =
               atomNameGlobalIndex_.begin();
           it != atomNameGlobalIndex_.end(); ++it) {
        int g_Index        = it->first;
        std::string a_name = it->second;
        averageChargeForEachType_[a_name] =
            (SDCount_[a_name] * averageChargeForEachType_[a_name] +
             totalChargeUsingGlobalIndex_[g_Index].front()) /
            (SDCount_[a_name] + 1);
        SDCount_[a_name]++;
      }
    }
    RealType epsilon = 1e-10;
    for (std::map<int, std::string>::iterator it = atomNameGlobalIndex_.begin();
         it != atomNameGlobalIndex_.end(); ++it) {
      int key            = it->first;
      std::string a_name = it->second;

      RealType averageCharge = averageChargeUsingGlobalIndex_[key];
      RealType averageChargeUsingFirstFrame = averageChargeForEachType_[a_name];
      RealType v_radius                     = vanderRUsingGlobalIndex_[key];
      RealType v_radius2                    = v_radius * v_radius;
      for (size_t index = 0; index < zPosUsingGlobalIndex_[key].size();
           ++index) {
        RealType z_pos  = zPosUsingGlobalIndex_[key][index];
        RealType charge = totalChargeUsingGlobalIndex_[key][index];
        RealType chargeDiff =
            fabs(charge - averageCharge) > epsilon ? charge - averageCharge : 0;
        RealType chargeDiffUsingFirstFrameAverage =
            fabs(charge - averageChargeUsingFirstFrame) > epsilon ?
                charge - averageChargeUsingFirstFrame :
                0;

        for (size_t i = 0; i < densityFlucZAverageAllFrame_.size(); ++i) {
          RealType z = -zAve / 2 + i * zAve / densityZAverageAllFrame_.size();
          RealType zdist = z_pos - z;

          RealType gaussian_scale =
              exp(-zdist * zdist / (v_radius2 * 2.0)) /
              (sliceVolume * (sqrt(2 * Constants::PI * v_radius * v_radius)));
          densityZAverageAllFrame_[i] += charge * gaussian_scale;

          densityFlucZAverageAllFrame_[i] += chargeDiff * gaussian_scale;
          absDensityFlucZAverageAllFrame_[i] +=
              abs(chargeDiff) * abs(chargeDiff) * gaussian_scale;

          densityFlucZAverageFirstFrame_[i] +=
              chargeDiffUsingFirstFrameAverage * gaussian_scale;
          absDensityFlucZAverageFirstFrame_[i] +=
              abs(chargeDiffUsingFirstFrameAverage) *
              abs(chargeDiffUsingFirstFrameAverage) * gaussian_scale;
        }
      }
    }

    writeDensity();

    if (genXYZ_) generateXYZForLastFrame();
  }